

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O2

void __thiscall
oout::GtestReportText::GtestReportText(GtestReportText *this,shared_ptr<const_oout::Result> *result)

{
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__GtestReportText_001cda20;
  std::__shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

GtestReportText::GtestReportText(const std::shared_ptr<const Result> &result)
	: result(result)
{
}